

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3StreamReader.cpp
# Opt level: O1

int __thiscall AC3StreamReader::readPacketTHD(AC3StreamReader *this,AVPacket *avPacket)

{
  int iVar1;
  uint8_t *__src;
  bool bVar2;
  int iVar3;
  long lVar4;
  CodecInfo *pCVar5;
  ostream *poVar6;
  pointer puVar7;
  long lVar8;
  int unaff_EBP;
  AVPacket *pAVar9;
  AVPacket *pAVar10;
  size_t num;
  byte bVar11;
  string local_68;
  MemoryBlock *local_48;
  AC3Codec *local_40;
  AVPacket *local_38;
  
  bVar11 = 0;
  if ((this->m_thdDemuxWaitAc3 == true) && ((this->m_delayedAc3Buffer).m_size != 0)) {
    pAVar9 = &this->m_delayedAc3Packet;
    pAVar10 = avPacket;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      pAVar10->pts = pAVar9->pts;
      pAVar9 = (AVPacket *)&pAVar9->dts;
      pAVar10 = (AVPacket *)&pAVar10->dts;
    }
    avPacket->codecID = (this->m_delayedAc3Packet).codecID;
    (this->m_delayedAc3Buffer).m_size = 0;
    this->m_thdDemuxWaitAc3 = false;
    lVar8 = this->m_nextAc3Time;
    avPacket->pts = lVar8;
    avPacket->dts = lVar8;
    *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x40;
    this->m_nextAc3Time = lVar8 + (this->super_AC3Codec).m_frameDuration;
    unaff_EBP = 0;
  }
  else {
    local_48 = &this->m_delayedAc3Buffer;
    local_40 = &this->super_AC3Codec;
    local_38 = &this->m_delayedAc3Packet;
    do {
      iVar3 = SimplePacketizerReader::readPacket(&this->super_SimplePacketizerReader,avPacket);
      if (iVar3 == 0) {
        if ((this->super_AC3Codec).m_state == stateDecodeTrueHDFirst) {
          if (this->m_thdDemuxWaitAc3 == true) {
            this->m_thdDemuxWaitAc3 = false;
            lVar8 = this->m_nextAc3Time;
            avPacket->pts = lVar8;
            avPacket->dts = lVar8;
            *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x40;
            this->m_nextAc3Time = lVar8 + (this->super_AC3Codec).m_frameDuration;
LAB_00176e82:
            bVar2 = false;
            unaff_EBP = 0;
          }
          else {
            if ((this->m_delayedAc3Buffer).m_size != 0) {
              pCVar5 = AC3Codec::getCodecInfo(local_40);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(pCVar5->displayName)._M_dataplus._M_p,
                                  (pCVar5->displayName)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," stream (track ",0xf);
              poVar6 = (ostream *)
                       std::ostream::operator<<
                                 (poVar6,(this->super_SimplePacketizerReader).
                                         super_AbstractStreamReader.m_streamIndex);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6,"): overlapped frame detected at position ",0x29);
              floatToTime_abi_cxx11_(&local_68,(double)avPacket->pts / 5292000000.0,',');
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,local_68._M_dataplus._M_p,local_68._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,". Remove frame.",0xf);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
              sLastMsg = true;
            }
            pAVar9 = avPacket;
            pAVar10 = local_38;
            for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
              pAVar10->pts = pAVar9->pts;
              pAVar9 = (AVPacket *)((long)pAVar9 + (ulong)bVar11 * -0x10 + 8);
              pAVar10 = (AVPacket *)((long)pAVar10 + (ulong)bVar11 * -0x10 + 8);
            }
            local_38->codecID = avPacket->codecID;
            (this->m_delayedAc3Buffer).m_size = 0;
            num = (size_t)avPacket->size;
            if (num != 0) {
              __src = avPacket->data;
              MemoryBlock::grow(local_48,num);
              memcpy((this->m_delayedAc3Buffer).m_data.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start + ((this->m_delayedAc3Buffer).m_size - num),
                     __src,num);
            }
            puVar7 = (this->m_delayedAc3Buffer).m_data.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (puVar7 == (this->m_delayedAc3Buffer).m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish) {
              puVar7 = (pointer)0x0;
            }
            (this->m_delayedAc3Packet).data = puVar7;
            bVar2 = true;
          }
        }
        else {
          lVar8 = this->m_totalTHDSamples;
          lVar4 = (lVar8 * 0x13b6d8300) / (long)(this->super_AC3Codec).mlp.m_samplerate;
          avPacket->pts = lVar4;
          avPacket->dts = lVar4;
          iVar3 = (this->super_AC3Codec).mlp.m_samples;
          this->m_totalTHDSamples = lVar8 + iVar3;
          iVar3 = this->m_demuxedTHDSamples + iVar3;
          this->m_demuxedTHDSamples = iVar3;
          bVar2 = false;
          unaff_EBP = 0;
          iVar1 = (this->super_AC3Codec).m_samples;
          if (iVar1 <= iVar3) {
            this->m_demuxedTHDSamples = iVar3 - iVar1;
            this->m_thdDemuxWaitAc3 = true;
            goto LAB_00176e82;
          }
        }
      }
      else {
        bVar2 = false;
        unaff_EBP = iVar3;
      }
    } while (bVar2);
  }
  return unaff_EBP;
}

Assistant:

int AC3StreamReader::readPacketTHD(AVPacket& avPacket)
{
    if (m_thdDemuxWaitAc3 && !m_delayedAc3Buffer.isEmpty())
    {
        avPacket = m_delayedAc3Packet;
        m_delayedAc3Buffer.clear();
        m_thdDemuxWaitAc3 = false;
        avPacket.dts = avPacket.pts = m_nextAc3Time;
        avPacket.flags |= AVPacket::IS_CORE_PACKET;
        m_nextAc3Time += m_frameDuration;
        return 0;
    }

    while (true)
    {
        const int rez = SimplePacketizerReader::readPacket(avPacket);
        if (rez != 0)
            return rez;

        const bool isAc3Packet = (m_state == AC3State::stateDecodeTrueHDFirst);

        if (isAc3Packet)
        {
            if (m_thdDemuxWaitAc3)
            {
                m_thdDemuxWaitAc3 = false;
                avPacket.dts = avPacket.pts = m_nextAc3Time;
                avPacket.flags |= AVPacket::IS_CORE_PACKET;
                m_nextAc3Time += m_frameDuration;
                return 0;
            }
            if (!m_delayedAc3Buffer.isEmpty())
            {
                LTRACE(LT_INFO, 2,
                       getCodecInfo().displayName
                           << " stream (track " << m_streamIndex << "): overlapped frame detected at position "
                           << floatToTime((double)(avPacket.pts - PTS_CONST_OFFSET) / INTERNAL_PTS_FREQ, ',')
                           << ". Remove frame.");
            }

            m_delayedAc3Packet = avPacket;
            m_delayedAc3Buffer.clear();
            m_delayedAc3Buffer.append(avPacket.data, avPacket.size);
            m_delayedAc3Packet.data = m_delayedAc3Buffer.data();
        }
        else
        {
            // thg packet
            avPacket.dts = avPacket.pts = m_totalTHDSamples * INTERNAL_PTS_FREQ / mlp.m_samplerate;

            m_totalTHDSamples += mlp.m_samples;
            m_demuxedTHDSamples += mlp.m_samples;
            if (m_demuxedTHDSamples >= m_samples)
            {
                m_demuxedTHDSamples -= m_samples;
                m_thdDemuxWaitAc3 = true;
            }
            return 0;
        }
    }
}